

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

void __thiscall google::protobuf::DescriptorProto::Clear(DescriptorProto *this)

{
  byte bVar1;
  string *psVar2;
  uint uVar3;
  long lVar4;
  
  bVar1 = (byte)this->_has_bits_[0];
  uVar3 = (uint)bVar1;
  if (bVar1 != 0) {
    if (((bVar1 & 1) != 0) &&
       (psVar2 = this->name_, psVar2 != (string *)internal::kEmptyString_abi_cxx11_)) {
      psVar2->_M_string_length = 0;
      *(psVar2->_M_dataplus)._M_p = '\0';
      uVar3 = this->_has_bits_[0];
    }
    if (((uVar3 & 0x40) != 0) && (this->options_ != (MessageOptions *)0x0)) {
      MessageOptions::Clear(this->options_);
    }
  }
  if (0 < (this->field_).super_RepeatedPtrFieldBase.current_size_) {
    lVar4 = 0;
    do {
      (**(code **)(*(this->field_).super_RepeatedPtrFieldBase.elements_[lVar4] + 0x20))();
      lVar4 = lVar4 + 1;
    } while (lVar4 < (this->field_).super_RepeatedPtrFieldBase.current_size_);
  }
  (this->field_).super_RepeatedPtrFieldBase.current_size_ = 0;
  if (0 < (this->extension_).super_RepeatedPtrFieldBase.current_size_) {
    lVar4 = 0;
    do {
      (**(code **)(*(this->extension_).super_RepeatedPtrFieldBase.elements_[lVar4] + 0x20))();
      lVar4 = lVar4 + 1;
    } while (lVar4 < (this->extension_).super_RepeatedPtrFieldBase.current_size_);
  }
  (this->extension_).super_RepeatedPtrFieldBase.current_size_ = 0;
  if (0 < (this->nested_type_).super_RepeatedPtrFieldBase.current_size_) {
    lVar4 = 0;
    do {
      (**(code **)(*(this->nested_type_).super_RepeatedPtrFieldBase.elements_[lVar4] + 0x20))();
      lVar4 = lVar4 + 1;
    } while (lVar4 < (this->nested_type_).super_RepeatedPtrFieldBase.current_size_);
  }
  (this->nested_type_).super_RepeatedPtrFieldBase.current_size_ = 0;
  if (0 < (this->enum_type_).super_RepeatedPtrFieldBase.current_size_) {
    lVar4 = 0;
    do {
      (**(code **)(*(this->enum_type_).super_RepeatedPtrFieldBase.elements_[lVar4] + 0x20))();
      lVar4 = lVar4 + 1;
    } while (lVar4 < (this->enum_type_).super_RepeatedPtrFieldBase.current_size_);
  }
  (this->enum_type_).super_RepeatedPtrFieldBase.current_size_ = 0;
  if (0 < (this->extension_range_).super_RepeatedPtrFieldBase.current_size_) {
    lVar4 = 0;
    do {
      (**(code **)(*(this->extension_range_).super_RepeatedPtrFieldBase.elements_[lVar4] + 0x20))();
      lVar4 = lVar4 + 1;
    } while (lVar4 < (this->extension_range_).super_RepeatedPtrFieldBase.current_size_);
  }
  (this->extension_range_).super_RepeatedPtrFieldBase.current_size_ = 0;
  this->_has_bits_[0] = 0;
  if ((this->_unknown_fields_).fields_ !=
      (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *)0x0
     ) {
    UnknownFieldSet::ClearFallback(&this->_unknown_fields_);
    return;
  }
  return;
}

Assistant:

void DescriptorProto::Clear() {
  if (_has_bits_[0 / 32] & (0xffu << (0 % 32))) {
    if (has_name()) {
      if (name_ != &::google::protobuf::internal::kEmptyString) {
        name_->clear();
      }
    }
    if (has_options()) {
      if (options_ != NULL) options_->::google::protobuf::MessageOptions::Clear();
    }
  }
  field_.Clear();
  extension_.Clear();
  nested_type_.Clear();
  enum_type_.Clear();
  extension_range_.Clear();
  ::memset(_has_bits_, 0, sizeof(_has_bits_));
  mutable_unknown_fields()->Clear();
}